

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

void __thiscall
kj::HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher>::rehash
          (HashIndex<kj::_::(anonymous_namespace)::SiPairStringHasher> *this,size_t targetSize)

{
  size_t in_R8;
  ArrayPtr<const_kj::_::HashBucket> oldBuckets;
  Array<kj::_::HashBucket> local_30;
  
  oldBuckets.size_ = targetSize;
  oldBuckets.ptr = (HashBucket *)(this->buckets).size_;
  _::rehash(&local_30,(_ *)(this->buckets).ptr,oldBuckets,in_R8);
  Array<kj::_::HashBucket>::operator=(&this->buckets,&local_30);
  Array<kj::_::HashBucket>::~Array(&local_30);
  this->erasedCount = 0;
  return;
}

Assistant:

void rehash(size_t targetSize) {
    buckets = _::rehash(buckets, targetSize);
    erasedCount = 0;
  }